

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdnsStorageHints::parse_map_item
          (cdnsStorageHints *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  uint8_t *puVar1;
  
  switch(val) {
  case 0:
    break;
  case 1:
    this = (cdnsStorageHints *)&this->query_response_signature_hints;
    break;
  case 2:
    this = (cdnsStorageHints *)&this->rr_hints;
    break;
  case 3:
    this = (cdnsStorageHints *)&this->other_data_hints;
    break;
  default:
    puVar1 = cbor_skip(in,in_max,err);
    goto LAB_0015da87;
  }
  puVar1 = cbor_parse_int64(in,in_max,&this->query_response_hints,0,err);
LAB_0015da87:
  if (puVar1 == (uint8_t *)0x0) {
    fprintf(_stderr,"Cannot parse cdnsStorageHints %d, err=%d\n",val & 0xffffffff,(ulong)(uint)*err)
    ;
  }
  return puVar1;
}

Assistant:

uint8_t* cdnsStorageHints::parse_map_item(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    switch (val) {
    case 0:
        in = cbor_parse_int64(in, in_max, &query_response_hints, 0, err);
        break;
    case 1:
        in = cbor_parse_int64(in, in_max, &query_response_signature_hints, 0, err);
        break;
    case 2:
        in = cbor_parse_int64(in, in_max, &rr_hints, 0, err);
        break;
    case 3:
        in = cbor_parse_int64(in, in_max, &other_data_hints, 0, err);
        break;
    default:
        in = cbor_skip(in, in_max, err);
        break;
    }
    if (in == NULL) {
        fprintf(stderr, "Cannot parse cdnsStorageHints %d, err=%d\n", (int)val, *err);
    }
    return in;
}